

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_unacked_packet_map.cc
# Opt level: O1

void __thiscall
quic::QuicUnackedPacketMap::PickLostPackets
          (QuicUnackedPacketMap *this,list<unsigned_short,_std::allocator<unsigned_short>_> *packets
          ,uint16_t latest_number)

{
  size_t *psVar1;
  ushort uVar2;
  _List_node_base *p_Var3;
  QuicByteCount QVar4;
  int iVar5;
  QuicByteCount QVar6;
  undefined2 in_register_00000012;
  bool bVar7;
  
  uVar2 = this->_least_unack_packet_number;
  iVar5 = (uint)uVar2 - CONCAT22(in_register_00000012,latest_number);
  if (iVar5 == 0x8000) {
    bVar7 = latest_number < uVar2;
  }
  else {
    bVar7 = -1 < (short)iVar5 && uVar2 != latest_number;
  }
  if (!bVar7) {
    while( true ) {
      uVar2 = this->_least_unack_packet_number;
      iVar5 = CONCAT22(in_register_00000012,latest_number) - (uint)uVar2;
      if (iVar5 == 0x8000) {
        bVar7 = uVar2 < latest_number;
      }
      else {
        bVar7 = -1 < (short)iVar5 && uVar2 != latest_number;
      }
      if (!bVar7) break;
      iVar5 = this->_unack_sequence_numbers[uVar2];
      if ((long)iVar5 != -1) {
        p_Var3 = (_List_node_base *)operator_new(0x18);
        *(short *)&p_Var3[1]._M_next = (short)iVar5;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        psVar1 = &(packets->super__List_base<unsigned_short,_std::allocator<unsigned_short>_>).
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        QVar6 = this->_bytes_in_flight - (ulong)*(ushort *)(&this->field_0x10 + (long)iVar5 * 0x28);
        if (this->_bytes_in_flight < (ulong)*(ushort *)(&this->field_0x10 + (long)iVar5 * 0x28)) {
          QVar6 = 0;
        }
        QVar4 = this->_packets_in_flight - 1;
        if (this->_packets_in_flight == 0) {
          QVar4 = 0;
        }
        this->_bytes_in_flight = QVar6;
        this->_packets_in_flight = QVar4;
        this->_unack_sequence_numbers[this->_least_unack_packet_number] = -1;
      }
      this->_least_unack_packet_number = this->_least_unack_packet_number + 1;
    }
    this->_least_unack_packet_number = latest_number;
  }
  return;
}

Assistant:

void QuicUnackedPacketMap::PickLostPackets(std::list<uint16_t> &packets, uint16_t latest_number)
	{
		if (IsNewer(_least_unack_packet_number, latest_number))
			return;
		int32_t sequence_number = -1;
		while (IsNewer(latest_number, _least_unack_packet_number)) {
			sequence_number = _unack_sequence_numbers[_least_unack_packet_number];
			if (sequence_number != -1) {
				packets.push_back(sequence_number);
#ifdef OUTPUT_VERBOSE_INFO
				dd::OutputDebugInfo("PickLostPackets packet lost, packet number = %d, sequence number = %d\r\n",
					_least_unack_packet_number, sequence_number);
#endif

				ReduceInflightPacket(sequence_number);
				_unack_sequence_numbers[_least_unack_packet_number] = -1;
			}

			_least_unack_packet_number++;

#ifdef OUTPUT_VERBOSE_INFO
			dd::OutputDebugInfo("PickLostPackets _unack_sequence_numbers[%d] = -1\r\n", _least_unack_packet_number);
#endif
		}
		_least_unack_packet_number = latest_number;

#ifdef OUTPUT_VERBOSE_INFO
		dd::OutputDebugInfo("PickLostPackets set _least_unack_packet_number = %d\r\n", _least_unack_packet_number);
#endif
	}